

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O2

bool __thiscall
absl::str_format_internal::FormatArgImpl::Dispatch<absl::str_format_internal::VoidPtr>
          (FormatArgImpl *this,Data arg,FormatConversionSpecImpl spec,void *out)

{
  undefined4 in_register_0000000c;
  FormatConversionSpecImpl conv;
  
  if (((ulong)arg.ptr & 0xff) == 0x11) {
    conv.precision_ = spec._0_4_;
    conv._0_8_ = arg.ptr;
    str_format_internal::FormatConvertImpl
              ((VoidPtr)this,conv,(FormatSinkImpl *)CONCAT44(in_register_0000000c,spec.precision_));
  }
  return (int)((ulong)arg.ptr & 0xff) == 0x11;
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }